

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

int __thiscall
crnlib::dxt_image::get_block_endpoints
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *low_endpoint,
          color_quad_u8 *high_endpoint,bool scaled)

{
  uint16 packed_color5;
  int iVar1;
  uint uVar2;
  uint h;
  uint l;
  uint r;
  uint b;
  uint g;
  uint local_4c;
  uint local_48;
  undefined1 local_44 [12];
  uchar local_38 [4];
  uchar local_34 [4];
  
  iVar1 = 0;
  local_48 = 0;
  local_4c = 0;
  local_44._4_8_ = high_endpoint;
  get_block_endpoints(this,block_x,block_y,element_index,&local_48,&local_4c);
  packed_color5 = (uint16)local_48;
  switch(this->m_element_type[element_index]) {
  case cColorDXT1:
    dxt1_block::unpack_color
              ((uint *)local_44,(uint *)local_34,(uint *)local_38,(uint16)local_48,scaled);
    (low_endpoint->field_0).field_0.r = local_44[0];
    (low_endpoint->field_0).field_0.g = local_34[0];
    (low_endpoint->field_0).field_0.b = local_38[0];
    dxt1_block::unpack_color
              ((uint *)local_44,(uint *)local_34,(uint *)local_38,(uint16)local_4c,scaled);
    *(uchar *)local_44._4_8_ = local_44[0];
    *(uchar *)(local_44._4_8_ + 1) = local_34[0];
    *(uchar *)(local_44._4_8_ + 2) = local_38[0];
    break;
  case cAlphaDXT3:
  case cAlphaDXT5:
    uVar2 = (uint)this->m_element_component_index[element_index];
    (low_endpoint->field_0).c[uVar2] = (uchar)local_48;
    ((uchar *)local_44._4_8_)[uVar2] = (uchar)local_4c;
    return uVar2;
  case cColorETC1:
    if ((this->m_pElements
         [(block_y * this->m_blocks_x + block_x) * this->m_num_elements_per_block + element_index].
         m_bytes[3] & 2) == 0) {
      etc1_block::unpack_color4((etc1_block *)local_44,(uint16)local_48,scaled,0xff);
      *(uchar *)&low_endpoint->field_0 = local_44[0];
      *(undefined1 *)((long)&low_endpoint->field_0 + 1) = local_44[1];
      *(undefined1 *)((long)&low_endpoint->field_0 + 2) = local_44[2];
      *(undefined1 *)((long)&low_endpoint->field_0 + 3) = local_44[3];
      etc1_block::unpack_color4((etc1_block *)local_44,(uint16)local_4c,scaled,0xff);
      *(undefined4 *)local_44._4_8_ = local_44._0_4_;
    }
    else {
      etc1_block::unpack_color5((etc1_block *)local_44,(uint16)local_48,scaled,0xff);
      *(uchar *)&low_endpoint->field_0 = local_44[0];
      *(undefined1 *)((long)&low_endpoint->field_0 + 1) = local_44[1];
      *(undefined1 *)((long)&low_endpoint->field_0 + 2) = local_44[2];
      *(undefined1 *)((long)&low_endpoint->field_0 + 3) = local_44[3];
      etc1_block::unpack_color5
                ((color_quad_u8 *)local_44._4_8_,packed_color5,(uint16)local_4c,scaled,0xff);
    }
    break;
  default:
    goto switchD_00193f8e_default;
  }
  iVar1 = -1;
switchD_00193f8e_default:
  return iVar1;
}

Assistant:

int dxt_image::get_block_endpoints(uint block_x, uint block_y, uint element_index, color_quad_u8& low_endpoint, color_quad_u8& high_endpoint, bool scaled) const {
  uint l = 0, h = 0;
  get_block_endpoints(block_x, block_y, element_index, l, h);

  switch (m_element_type[element_index]) {
    case cColorETC1: {
      const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
      if (src_block.get_diff_bit()) {
        low_endpoint = etc1_block::unpack_color5(static_cast<uint16>(l), scaled);
        etc1_block::unpack_color5(high_endpoint, static_cast<uint16>(l), static_cast<uint16>(h), scaled);
      } else {
        low_endpoint = etc1_block::unpack_color4(static_cast<uint16>(l), scaled);
        high_endpoint = etc1_block::unpack_color4(static_cast<uint16>(h), scaled);
      }

      return -1;
    }
    case cColorDXT1: {
      uint r, g, b;

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(l), scaled);
      low_endpoint.r = static_cast<uint8>(r);
      low_endpoint.g = static_cast<uint8>(g);
      low_endpoint.b = static_cast<uint8>(b);

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(h), scaled);
      high_endpoint.r = static_cast<uint8>(r);
      high_endpoint.g = static_cast<uint8>(g);
      high_endpoint.b = static_cast<uint8>(b);

      return -1;
    }
    case cAlphaDXT5: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    case cAlphaDXT3: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    default:
      break;
  }

  return 0;
}